

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_NumberOfExprPrecedence_Test::ExprWriterTest_NumberOfExprPrecedence_Test
          (ExprWriterTest_NumberOfExprPrecedence_Test *this)

{
  ExprWriterTest::ExprWriterTest(&this->super_ExprWriterTest);
  (this->super_ExprWriterTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprWriterTest_0016c930;
  (this->super_ExprWriterTest).super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ExprWriterTest_NumberOfExprPrecedence_Test_0016c970;
  return;
}

Assistant:

TEST_F(ExprWriterTest, NumberOfExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  NumericExpr args[] = {MakeConst(42), x1, x2};
  auto e = MakeIterated(ex::NUMBEROF, args);
  NumericExpr args2[] = {e, e, e};
  CHECK_WRITE("numberof numberof 42 in (x1, x2) in ("
      "numberof 42 in (x1, x2), numberof 42 in (x1, x2))",
              MakeIterated(ex::NUMBEROF, args2));
  auto e2 = MakeBinary(ex::ADD, x1, x2);
  NumericExpr args3[] = {e2, e2, e2};
  CHECK_WRITE("numberof x1 + x2 in (x1 + x2, x1 + x2)",
              MakeIterated(ex::NUMBEROF, args3));
}